

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportBuildFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  _Base_ptr p_Var1;
  cmMakefile *this_00;
  pointer pbVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  string *psVar5;
  ostream *poVar6;
  pointer puVar7;
  pointer puVar8;
  char cVar9;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  undefined8 uVar10;
  long lVar11;
  _Alloc_hider _Var12;
  cmLocalGenerator *config;
  cmLocalGenerator *lg;
  _Base_ptr p_Var13;
  bool bVar14;
  bool bVar15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view str;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string escapedFile;
  string local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  ostringstream e;
  undefined8 local_138 [33];
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&fileEntries,fileSet);
  cmFileSet::CompileDirectoryEntries(&directoryEntries,fileSet);
  pbVar2 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    config = (cmLocalGenerator *)
             configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      lg = config;
      cmFileSet::EvaluateDirectoryEntries
                (&directories,fileSet,&directoryEntries,gte->LocalGenerator,(string *)config,gte,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar7 = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &files._M_t._M_impl.super__Rb_tree_header._M_header;
      files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar8 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar7; puVar8 = puVar8 + 1
          ) {
        lg = gte->LocalGenerator;
        cmFileSet::EvaluateFileEntry
                  (fileSet,&directories,&files,puVar8,lg,(string *)config,gte,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      lVar11 = (long)directoryEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)directoryEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      puVar7 = directoryEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar11) {
        puVar7 = (pointer)((long)&((directoryEntries.
                                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl +
                          ((long)directoryEntries.
                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)directoryEntries.
                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U));
        lVar11 = lVar11 + 1;
        puVar8 = directoryEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          if ((puVar8[-2]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar8 = puVar8 + -2;
            goto LAB_00506169;
          }
          if ((puVar8[-1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar8 = puVar8 + -1;
            goto LAB_00506169;
          }
          if (((puVar8->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) goto LAB_00506169;
          if ((puVar8[1]._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition != false) {
            puVar8 = puVar8 + 1;
            goto LAB_00506169;
          }
          lVar11 = lVar11 + -1;
          puVar8 = puVar8 + 4;
        } while (1 < lVar11);
      }
      lVar11 = (long)directoryEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
      if (lVar11 == 1) {
LAB_00506146:
        puVar8 = puVar7;
        if (((puVar7->_M_t).
             super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
             .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
            HadContextSensitiveCondition == false) {
          puVar8 = directoryEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (lVar11 == 2) {
LAB_00506136:
        puVar8 = puVar7;
        if (((puVar7->_M_t).
             super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
             .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
            HadContextSensitiveCondition == false) {
          puVar7 = puVar7 + 1;
          goto LAB_00506146;
        }
      }
      else {
        puVar8 = directoryEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((lVar11 == 3) &&
           (puVar8 = puVar7,
           ((puVar7->_M_t).
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
           HadContextSensitiveCondition == false)) {
          puVar7 = puVar7 + 1;
          goto LAB_00506136;
        }
      }
LAB_00506169:
      bVar14 = true;
      if (puVar8 == directoryEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        lVar11 = (long)fileEntries.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)fileEntries.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        puVar7 = fileEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0 < lVar11) {
          puVar7 = (pointer)((long)&((fileEntries.
                                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                    _M_head_impl +
                            ((long)fileEntries.
                                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)fileEntries.
                                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U))
          ;
          lVar11 = lVar11 + 1;
          puVar8 = fileEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((puVar8[-2]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar8 = puVar8 + -2;
              goto LAB_00506255;
            }
            if ((puVar8[-1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar8 = puVar8 + -1;
              goto LAB_00506255;
            }
            if (((puVar8->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) goto LAB_00506255;
            if ((puVar8[1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar8 = puVar8 + 1;
              goto LAB_00506255;
            }
            lVar11 = lVar11 + -1;
            puVar8 = puVar8 + 4;
          } while (1 < lVar11);
        }
        lVar11 = (long)fileEntries.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
        if (lVar11 == 1) {
LAB_00506232:
          puVar8 = puVar7;
          if (((puVar7->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar8 = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else if (lVar11 == 2) {
LAB_00506222:
          puVar8 = puVar7;
          if (((puVar7->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar7 = puVar7 + 1;
            goto LAB_00506232;
          }
        }
        else {
          puVar8 = fileEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((lVar11 == 3) &&
             (puVar8 = puVar7,
             ((puVar7->_M_t).
              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
             HadContextSensitiveCondition == false)) {
            puVar7 = puVar7 + 1;
            goto LAB_00506222;
          }
        }
LAB_00506255:
        bVar14 = puVar8 != fileEntries.
                           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      }
      p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (((bVar14) && ((fileSet->Type)._M_string_length == 0xb)) &&
         (iVar3 = bcmp((fileSet->Type)._M_dataplus._M_p,"CXX_MODULES",0xb),
         p_Var4 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left, iVar3 == 0)) {
        this_00 = this->LG->Makefile;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,"The \"",5);
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" target\'s interface file set \"",0x1f);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(fileSet->Name)._M_dataplus._M_p,(fileSet->Name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" of type \"",0xb);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(fileSet->Type)._M_dataplus._M_p,(fileSet->Type)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" contains context-sensitive file entries which is not supported.",0x41)
        ;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base((ios_base *)local_138);
        cVar9 = '\x01';
        bVar14 = false;
      }
      else {
        for (; (_Rb_tree_header *)p_Var4 != &files._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          p_Var1 = p_Var4[2]._M_parent;
          for (p_Var13 = *(_Base_ptr *)(p_Var4 + 2); p_Var13 != p_Var1; p_Var13 = p_Var13 + 1) {
            str._M_str = &DAT_00000001;
            str._M_len = *(size_t *)p_Var13;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      (&escapedFile,(cmOutputConverter *)p_Var13->_M_parent,str,(WrapQuotes)lg);
            if ((bVar14) &&
               ((long)configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
              _e = 0xc;
              local_138[0] = 0;
              views_00._M_len = 5;
              views_00._M_array = (iterator)&e;
              cmCatViews(&local_2e0,views_00);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &resultVector,&local_2e0);
              uVar10 = local_2e0.field_2._M_allocated_capacity;
              _Var12._M_p = local_2e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
LAB_005064b8:
                operator_delete(_Var12._M_p,(ulong)(uVar10 + 1));
              }
            }
            else {
              local_2e0._M_dataplus._M_p = (pointer)0x0;
              local_2e0._M_string_length = 1;
              local_2e0.field_2._M_allocated_capacity = (long)&local_2e0.field_2 + 8;
              local_2e0.field_2._M_local_buf[8] = '\"';
              _e = 1;
              views._M_len = 3;
              views._M_array = (iterator)&e;
              cmCatViews(&local_218,views);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &resultVector,&local_218);
              uVar10 = local_218.field_2._M_allocated_capacity;
              _Var12._M_p = local_218._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_005064b8;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)escapedFile._M_dataplus._M_p != &escapedFile.field_2) {
              operator_delete(escapedFile._M_dataplus._M_p,
                              escapedFile.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if (bVar14) {
          bVar15 = (long)configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start == 0x20;
          bVar14 = !bVar15;
          cVar9 = bVar15 * '\x02';
        }
        else {
          cVar9 = '\x02';
          bVar14 = false;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&files._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directories);
      if (!bVar14) goto LAB_005066aa;
      config = (cmLocalGenerator *)&(config->super_cmOutputConverter).LinkScriptShell;
    } while (config != (cmLocalGenerator *)pbVar2);
    cVar9 = '\x02';
LAB_005066aa:
    if (cVar9 != '\x02') goto LAB_005066d6;
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&resultVector,separator,(string_view)ZEXT816(0));
LAB_005066d6:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&directoryEntries);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&fileEntries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resultVector);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetFiles(cmGeneratorTarget* gte,
                                                        cmFileSet* fileSet,
                                                        cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive && type == "CXX_MODULES"_s) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        auto escapedFile = cmOutputConverter::EscapeForCMake(
          filename, cmOutputConverter::WrapQuotes::NoWrap);
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.emplace_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}